

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrGLContext.cpp
# Opt level: O3

void __thiscall
sglr::GLContext::copyTexSubImage1D
          (GLContext *this,deUint32 target,int level,int xoffset,int x,int y,int width)

{
  ostringstream *this_00;
  int iVar1;
  undefined4 extraout_var;
  int iVar2;
  int iVar3;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [384];
  
  if ((this->m_logFlags & 1) != 0) {
    local_1b0._0_8_ = this->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"glCopyTexSubImage1D(",0x14);
    local_1c0.m_getName = glu::getTextureTargetName;
    local_1c0.m_value = target;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::operator<<(this_00,level);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::operator<<(this_00,xoffset);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::operator<<(this_00,x);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::operator<<(this_00,y);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::operator<<(this_00,width);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  }
  iVar2 = 0;
  iVar3 = 0;
  if (this->m_readFramebufferBinding == 0) {
    iVar2 = (this->m_baseViewport).m_data[0];
    iVar3 = (this->m_baseViewport).m_data[1];
  }
  iVar1 = (*this->m_context->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x358))
            (target,level,xoffset,iVar2 + x,iVar3 + y,width);
  return;
}

Assistant:

void GLContext::copyTexSubImage1D (deUint32 target, int level, int xoffset, int x, int y, int width)
{
	if ((m_logFlags & GLCONTEXT_LOG_CALLS) != 0)
		m_log << TestLog::Message << "glCopyTexSubImage1D("
								  << glu::getTextureTargetStr(target) << ", "
								  << level << ", "
								  << xoffset << ", "
								  << x << ", " << y << ", "
								  << width << ")"
			  << TestLog::EndMessage;

	tcu::IVec2 offset = getReadOffset();
	m_context.getFunctions().copyTexSubImage1D(target, level, xoffset, offset.x()+x, offset.y()+y, width);
}